

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Update_Bill_File
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,
          ofstream *inFile)

{
  pointer pvVar1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer pPVar5;
  long lVar6;
  int k;
  ulong uVar7;
  ulong uVar8;
  ofstream abus;
  
  system("pause");
  std::ofstream::ofstream(&abus);
  std::ofstream::open((char *)&abus,0x11c158);
  for (uVar4 = 0;
      pPVar5 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5) / 0x150);
      uVar4 = uVar4 + 1) {
    uVar8 = 0;
    while( true ) {
      pvVar2 = Patient::Bill_Info_getter_abi_cxx11_(pPVar5 + uVar4);
      if ((ulong)(((long)(pvVar2->
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar2->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar8) break;
      lVar6 = 0;
      uVar7 = 0;
      while( true ) {
        pvVar2 = Patient::Bill_Info_getter_abi_cxx11_
                           ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)
                            ._M_impl.super__Vector_impl_data._M_start + uVar4);
        pvVar1 = (pvVar2->
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pvVar1->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data + 8) -
                    *(long *)&(pvVar1->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data >> 5) <= uVar7) break;
        pvVar2 = Patient::Bill_Info_getter_abi_cxx11_
                           ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)
                            ._M_impl.super__Vector_impl_data._M_start + uVar4);
        poVar3 = std::operator<<((ostream *)&abus,
                                 (string *)
                                 (*(long *)&(pvVar2->
                                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar8].
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data + lVar6));
        std::operator<<(poVar3," ");
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x20;
      }
      uVar8 = uVar8 + 1;
      pPVar5 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    std::operator<<((ostream *)&abus,"\n");
  }
  std::ofstream::~ofstream(&abus);
  return;
}

Assistant:

void Hospital:: Update_Bill_File (vector<Patient>&All_Of_Patients , ofstream& inFile) {
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Bill.txt");
    //abus <<"Asghar";

    for (int i = 0; i < All_Of_Patients.size(); i++) {
        for (int j = 0; j < All_Of_Patients[i].Bill_Info_getter().size(); ++j) {
            for (int k = 0; k <All_Of_Patients[i].Bill_Info_getter()[0].size() ; ++k) {
                abus << All_Of_Patients[i].Bill_Info_getter()[j][k] << " ";
            }
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}